

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mspm.cpp
# Opt level: O1

void __thiscall pg::MSPMSolver::solve(MSPMSolver *this,int node,int str)

{
  Game *pGVar1;
  ostream *poVar2;
  long *plVar3;
  Error *this_00;
  int iVar4;
  int iVar5;
  ulong uVar6;
  int *piVar7;
  int iVar8;
  int *piVar9;
  uint win;
  long lVar10;
  bool bVar11;
  bool bVar12;
  int from;
  queue<int,_std::deque<int,_std::allocator<int>_>_> q;
  int local_94;
  int local_90;
  int local_8c;
  _Deque_base<int,_std::allocator<int>_> local_88;
  
  local_8c = this->pms[(long)node * (long)this->k];
  bVar11 = local_8c != -1;
  local_94 = node;
  if ((this->pms + (long)node * (long)this->k)[bVar11] != -1) {
    this_00 = (Error *)__cxa_allocate_exception(0x40);
    Error::Error(this_00,"logic error",
                 "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]oink/src/solvers/mspm.cpp"
                 ,0xef);
    __cxa_throw(this_00,&Error::typeinfo,Error::~Error);
  }
  if ((this->super_Solver).trace != 0) {
    poVar2 = (this->super_Solver).logger;
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar2,"Detected \x1b[1;31mTop\x1b[m from ",0x1c);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_94);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"/",1);
    poVar2 = (ostream *)
             std::ostream::operator<<(poVar2,((this->super_Solver).game)->_priority[local_94]);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," to ",4);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,str);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"/",1);
    plVar3 = (long *)std::ostream::operator<<(poVar2,((this->super_Solver).game)->_priority[str]);
    std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
    std::ostream::put((char)plVar3);
    std::ostream::flush();
  }
  bVar12 = local_8c != -1;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_map_size = 0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_cur = (int *)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_first = (int *)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_last = (int *)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_cur = (int *)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  std::_Deque_base<int,_std::allocator<int>_>::_M_initialize_map(&local_88,0);
  iVar5 = -1;
  if ((((((this->super_Solver).game)->_owner)._bits[(ulong)(long)local_94 >> 6] >>
        ((long)local_94 & 0x3fU) & 1) == 0) != bVar12) {
    iVar5 = str;
  }
  win = (uint)bVar11;
  Oink::solve((this->super_Solver).oink,local_94,win,iVar5);
  this->cover[local_94] = -1;
  if (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur ==
      local_88._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
    std::deque<int,std::allocator<int>>::_M_push_back_aux<int_const&>
              ((deque<int,std::allocator<int>> *)&local_88,&local_94);
  }
  else {
    *local_88._M_impl.super__Deque_impl_data._M_finish._M_cur = local_94;
    local_88._M_impl.super__Deque_impl_data._M_finish._M_cur =
         local_88._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
  }
  todo_push(this,local_94);
  if (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur !=
      local_88._M_impl.super__Deque_impl_data._M_start._M_cur) {
    do {
      iVar5 = *local_88._M_impl.super__Deque_impl_data._M_start._M_cur;
      if (local_88._M_impl.super__Deque_impl_data._M_start._M_cur ==
          local_88._M_impl.super__Deque_impl_data._M_start._M_last + -1) {
        operator_delete(local_88._M_impl.super__Deque_impl_data._M_start._M_first,0x200);
        local_88._M_impl.super__Deque_impl_data._M_start._M_cur =
             local_88._M_impl.super__Deque_impl_data._M_start._M_node[1];
        local_88._M_impl.super__Deque_impl_data._M_start._M_last =
             local_88._M_impl.super__Deque_impl_data._M_start._M_cur + 0x80;
        local_88._M_impl.super__Deque_impl_data._M_start._M_first =
             local_88._M_impl.super__Deque_impl_data._M_start._M_cur;
        local_88._M_impl.super__Deque_impl_data._M_start._M_node =
             local_88._M_impl.super__Deque_impl_data._M_start._M_node + 1;
      }
      else {
        local_88._M_impl.super__Deque_impl_data._M_start._M_cur =
             local_88._M_impl.super__Deque_impl_data._M_start._M_cur + 1;
      }
      pGVar1 = (this->super_Solver).game;
      piVar9 = pGVar1->_inedges;
      iVar4 = pGVar1->_firstins[iVar5];
      if (piVar9[iVar4] != -1) {
        piVar9 = piVar9 + iVar4;
        do {
          local_90 = *piVar9;
          uVar6 = (ulong)local_90;
          if ((this->cover[uVar6] == 0) &&
             (pGVar1 = (this->super_Solver).game,
             pGVar1->_priority[uVar6] <= pGVar1->_priority[local_94])) {
            iVar4 = iVar5;
            if ((((pGVar1->_owner)._bits[uVar6 >> 6] >> (uVar6 & 0x3f) & 1) == 0) ==
                (local_8c != -1)) {
              iVar8 = pGVar1->_outedges[pGVar1->_firstouts[uVar6]];
              iVar4 = -1;
              if (iVar8 != -1) {
                piVar7 = pGVar1->_outedges + (long)pGVar1->_firstouts[uVar6] + 1;
                bVar11 = false;
                do {
                  if (-1 < this->cover[iVar8]) {
                    bVar11 = true;
                    break;
                  }
                  iVar8 = *piVar7;
                  piVar7 = piVar7 + 1;
                } while (iVar8 != -1);
                if (bVar11) goto LAB_0016c8ea;
              }
            }
            Oink::solve((this->super_Solver).oink,local_90,win,iVar4);
            this->cover[local_90] = -1;
            this->pms[(int)(local_90 * this->k + win)] = -1;
            if (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                local_88._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
              std::deque<int,std::allocator<int>>::_M_push_back_aux<int_const&>
                        ((deque<int,std::allocator<int>> *)&local_88,&local_90);
            }
            else {
              *local_88._M_impl.super__Deque_impl_data._M_finish._M_cur = local_90;
              local_88._M_impl.super__Deque_impl_data._M_finish._M_cur =
                   local_88._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
            }
            todo_push(this,local_90);
          }
LAB_0016c8ea:
          piVar7 = piVar9 + 1;
          piVar9 = piVar9 + 1;
        } while (*piVar7 != -1);
      }
    } while (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur !=
             local_88._M_impl.super__Deque_impl_data._M_start._M_cur);
  }
  iVar5 = this->coverdepth + 1;
  this->coverdepth = iVar5;
  coverlower(this,local_94,iVar5);
  if (0 < (this->super_Solver).trace) {
    poVar2 = (this->super_Solver).logger;
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"Cover status:",0xd);
    std::ios::widen((char)poVar2->_vptr_basic_ostream[-3] + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    if (0 < ((this->super_Solver).game)->n_vertices) {
      lVar10 = 0;
      do {
        if (this->cover[lVar10] != 0) {
          poVar2 = (ostream *)std::ostream::operator<<((this->super_Solver).logger,(int)lVar10);
          std::__ostream_insert<char,std::char_traits<char>>(poVar2,"/",1);
          poVar2 = (ostream *)
                   std::ostream::operator<<(poVar2,((this->super_Solver).game)->_priority[lVar10]);
          std::__ostream_insert<char,std::char_traits<char>>(poVar2,": ",2);
          plVar3 = (long *)std::ostream::operator<<(poVar2,this->cover[lVar10]);
          std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
          std::ostream::put((char)plVar3);
          std::ostream::flush();
        }
        lVar10 = lVar10 + 1;
      } while (lVar10 < ((this->super_Solver).game)->n_vertices);
    }
  }
  std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base(&local_88);
  return;
}

Assistant:

void
MSPMSolver::solve(int node, int str)
{
    int *pm = pms + k*node;
    const int pl = pm[0] == -1 ? 0 : 1;
    if (pm[pl] != -1) LOGIC_ERROR;

    if (trace) logger << "Detected \033[1;31mTop\033[m from " << node << "/" << priority(node) << " to " << str << "/" << priority(str) << std::endl;

    // initialize
    std::queue<int> q;

    // solve <node>
    Solver::solve(node, pl, owner(node) == pl ? str : -1);
    // if (pl == (priority(node)&1)) counts[priority(node)]--;
    cover[node] = -1;
    q.push(node);
    todo_push(node);

    // attract within uncovered area to <node> for <pl>
    while (!q.empty()) {
        int n = q.front();
        q.pop();
        for (auto curedge = ins(n); *curedge != -1; curedge++) {
            int from = *curedge;
            // logger << "trying edge " << from << "/" << priority(from) << " to " << n << std::endl;
            if (cover[from]) continue;
            if (priority(from) > priority(node)) continue;
            if (owner(from) != pl) {
                bool escapes = false;
                for (auto curedge = outs(from); *curedge != -1; curedge++) {
                    int to = *curedge;
                    if (cover[to] < 0) continue; // disabled or already solved
                    // if (cover[to] != 0) LOGIC_ERROR; // should have been covered
                    // ^--- it can escape, happens when alternating!
                    escapes = true;
                    break;
                }
                if (escapes) continue;
            }
            Solver::solve(from, pl, owner(from) == pl ? n : -1);
            // if (winner == (priority(from)&1)) counts[priority(from)]--;
            cover[from] = -1;
            pms[k*from+pl] = -1;
            q.push(from);
            todo_push(from);
        }
    }

    // after lifting, cover everything that is lower
    coverlower(node, ++coverdepth);

    if (trace >= 1) {
        logger << "Cover status:" << std::endl;
        for (int i=0; i<nodecount(); i++) {
            if (cover[i]) logger << i << "/" << priority(i) << ": " << cover[i] << std::endl;
        }
    }
}